

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int binstrrcaseless(const_bstring b1,int pos,const_bstring b2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  __int32_t **pp_Var7;
  int iVar8;
  int iVar9;
  long lVar10;
  uchar *puVar11;
  
  iVar9 = -1;
  if (((((b1 != (const_bstring)0x0) && (puVar11 = b1->data, puVar11 != (uchar *)0x0)) &&
       (uVar3 = b1->slen, b2 != (const_bstring)0x0 && -1 < (int)uVar3)) &&
      ((puVar5 = b2->data, puVar5 != (uchar *)0x0 && (iVar4 = b2->slen, -1 < iVar4)))) &&
     (iVar9 = pos, uVar3 != pos || iVar4 != 0)) {
    iVar9 = -1;
    if ((uint)pos <= uVar3) {
      iVar9 = pos;
    }
    if (((uint)pos <= uVar3 && iVar4 != 0) &&
       (iVar9 = 0, (pos != 0 || puVar11 != puVar5) || (int)uVar3 < iVar4)) {
      iVar6 = uVar3 - iVar4;
      iVar9 = -1;
      if (-1 < iVar6) {
        iVar8 = pos;
        if (iVar6 < pos) {
          iVar8 = iVar6;
        }
        lVar10 = (long)iVar6;
        if ((long)pos < (long)iVar6) {
          lVar10 = (long)pos;
        }
        puVar11 = puVar11 + lVar10;
        while( true ) {
          lVar10 = 0;
          while( true ) {
            bVar1 = puVar5[lVar10];
            bVar2 = puVar11[lVar10];
            if ((bVar1 != bVar2) &&
               (pp_Var7 = __ctype_tolower_loc(), (*pp_Var7)[bVar1] != (*pp_Var7)[bVar2])) break;
            lVar10 = lVar10 + 1;
            if (iVar4 <= (int)lVar10) {
              return iVar8;
            }
          }
          if (iVar8 < 1) break;
          iVar8 = iVar8 + -1;
          puVar11 = puVar11 + -1;
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int binstrrcaseless (const_bstring b1, int pos, const_bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen)
		return BSTR_OK;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}